

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O2

void ylt::metric::detail::stat_io(void)

{
  int iVar1;
  FILE *pFVar2;
  string *psVar3;
  ProcIO s;
  shared_ptr<_IO_FILE> stream_file;
  
  if (stat_io()::process_io_read_bytes_second == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_io()::process_io_read_bytes_second);
    if (iVar1 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"ylt_process_io_read_bytes_second",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_read_bytes_second,psVar3);
      std::__cxx11::string::~string((string *)&s);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_read_bytes_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_read_bytes_second);
    }
  }
  if (stat_io()::process_io_write_bytes_second == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_io()::process_io_write_bytes_second);
    if (iVar1 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"ylt_process_io_write_bytes_second",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_write_bytes_second,psVar3);
      std::__cxx11::string::~string((string *)&s);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_write_bytes_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_write_bytes_second);
    }
  }
  if (stat_io()::process_io_read_second == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_io()::process_io_read_second);
    if (iVar1 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"ylt_process_io_read_second",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_read_second,psVar3);
      std::__cxx11::string::~string((string *)&s);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_read_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_read_second);
    }
  }
  if (stat_io()::process_io_write_second == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_io()::process_io_write_second);
    if (iVar1 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,"ylt_process_io_write_second",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_write_second,psVar3);
      std::__cxx11::string::~string((string *)&s);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_write_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_write_second);
    }
  }
  s.read_bytes = 0;
  s.write_bytes = 0;
  s.syscr = 0;
  s.syscw = 0;
  s.rchar = 0;
  s.wchar = 0;
  s.cancelled_write_bytes = 0;
  pFVar2 = fopen("/proc/self/io","r");
  std::__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<_IO_FILE,ylt::metric::detail::stat_io()::_lambda(_IO_FILE*)_1_,void>
            ((__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2> *)&stream_file,pFVar2);
  if (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = __isoc99_fscanf(stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,"%*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu",&s,
                            &s.wchar,&s.syscr,&s.syscw,&s.read_bytes,&s.write_bytes,
                            &s.cancelled_write_bytes);
    if (iVar1 == 7) {
      basic_static_counter<long>::update
                (&(stat_io::process_io_read_bytes_second.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,s.rchar);
      basic_static_counter<long>::update
                (&(stat_io::process_io_write_bytes_second.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,s.wchar);
      basic_static_counter<long>::update
                (&(stat_io::process_io_read_second.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,s.syscr);
      basic_static_counter<long>::update
                (&(stat_io::process_io_write_second.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,s.syscw);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

inline void stat_io() {
  static auto process_io_read_bytes_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_read_bytes_second");
  static auto process_io_write_bytes_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_write_bytes_second");
  static auto process_io_read_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_read_second");
  static auto process_io_write_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_write_second");

  ProcIO s{};
#if defined(__APPLE__)
#else
  auto stream_file =
      std::shared_ptr<FILE>(fopen("/proc/self/io", "r"), [](FILE *ptr) {
        fclose(ptr);
      });
  if (stream_file == nullptr) {
    return;
  }

  if (fscanf(stream_file.get(),
             "%*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu",
             &s.rchar, &s.wchar, &s.syscr, &s.syscw, &s.read_bytes,
             &s.write_bytes, &s.cancelled_write_bytes) != 7) {
    return;
  }
#endif

  process_io_read_bytes_second->update(s.rchar);
  process_io_write_bytes_second->update(s.wchar);
  process_io_read_second->update(s.syscr);
  process_io_write_second->update(s.syscw);
}